

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# momento_test.cc
# Opt level: O2

int main(void)

{
  Originator *pOVar1;
  pointer ppMVar2;
  uint __line;
  Originator *pOVar3;
  CareTaker *this;
  char *__assertion;
  
  pOVar3 = (Originator *)operator_new(4);
  pOVar3->state = 0;
  this = (CareTaker *)operator_new(0x20);
  this->originator = pOVar3;
  (this->history).super__Vector_base<Momento_*,_std::allocator<Momento_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->history).super__Vector_base<Momento_*,_std::allocator<Momento_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->history).super__Vector_base<Momento_*,_std::allocator<Momento_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pOVar3->state = 10;
  CareTaker::save(this);
  if (pOVar3->state == 10) {
    pOVar3->state = 0x14;
    CareTaker::save(this);
    if (pOVar3->state == 0x14) {
      pOVar1 = this->originator;
      ppMVar2 = (this->history).super__Vector_base<Momento_*,_std::allocator<Momento_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      (this->history).super__Vector_base<Momento_*,_std::allocator<Momento_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppMVar2 + -1;
      pOVar1->state = ppMVar2[-2]->state;
      if (pOVar3->state == 10) {
        return 0;
      }
      __assertion = "value == 10";
      __line = 0x1a;
    }
    else {
      __assertion = "value == 20";
      __line = 0x15;
    }
  }
  else {
    __assertion = "value == 10";
    __line = 0xf;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/behavioral/momento_test.cc"
                ,__line,"int main()");
}

Assistant:

int main() {
  Originator *originator = new Originator;
  CareTaker *caretaker = new CareTaker(originator);

  originator->setState(10);
  caretaker->save();

  int value = originator->getState();
  assert(value == 10);

  originator->setState(20);
  caretaker->save();

  value = originator->getState();
  assert(value == 20);

  caretaker->undo();

  value = originator->getState();
  assert(value == 10);
}